

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall
GenericModelPrivate::moveRowsSameParent
          (GenericModelPrivate *this,QModelIndex *sourceParent,int sourceRow,int count,
          int destinationChild)

{
  GenericModelItem *this_00;
  iterator iVar1;
  QMap<int,_QVariant> *pQVar2;
  QMap<int,_QVariant> *pQVar3;
  QMap<int,_QVariant> *pQVar4;
  QVector<RolesContainer> *this_01;
  
  this_00 = itemForIndex(this,sourceParent);
  GenericModelItem::moveChildRows(this_00,sourceRow,count,destinationChild);
  if (this_00 == this->root) {
    this_01 = &this->vHeaderData;
    iVar1 = QList<QMap<int,_QVariant>_>::begin(this_01);
    pQVar4 = iVar1.i + sourceRow;
    iVar1 = QList<QMap<int,_QVariant>_>::begin(this_01);
    pQVar3 = iVar1.i + (long)sourceRow + (long)count;
    iVar1 = QList<QMap<int,_QVariant>_>::begin(this_01);
    pQVar2 = iVar1.i + destinationChild;
    if (destinationChild < sourceRow) {
      pQVar2 = pQVar3;
      pQVar3 = pQVar4;
      pQVar4 = iVar1.i + destinationChild;
    }
    std::_V2::__rotate<QList<QMap<int,QVariant>>::iterator>(pQVar4,pQVar3,pQVar2);
    return;
  }
  return;
}

Assistant:

void GenericModelPrivate::moveRowsSameParent(const QModelIndex &sourceParent, int sourceRow, int count, int destinationChild)
{
    GenericModelItem *item = itemForIndex(sourceParent);
    item->moveChildRows(sourceRow, count, destinationChild);
    if (item == root) {
        const auto sourceBegin = vHeaderData.begin() + sourceRow;
        const auto sourceEnd = vHeaderData.begin() + sourceRow + count;
        const auto destination = vHeaderData.begin() + destinationChild;
        if (destinationChild < sourceRow)
            std::rotate(destination, sourceBegin, sourceEnd);
        else
            std::rotate(sourceBegin, sourceEnd, destination);
    }
}